

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

bool insertToFiniteAutomation(adjacencyType *finiteAutomation,int start,int final,string *by)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Rb_tree_header *p_Var2;
  pointer pmVar3;
  pointer pcVar4;
  set<int,_std::less<int>,_std::allocator<int>_> *psVar5;
  byte bVar6;
  iterator iVar7;
  pair<std::_Rb_tree_iterator<int>,_bool> pVar8;
  initializer_list<int> __l;
  allocator_type local_b2;
  less<int> local_b1;
  int local_b0;
  int local_ac;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_a8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>
  local_78;
  
  local_b0 = final;
  iVar7 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
          ::find(&(finiteAutomation->
                  super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start[start]._M_t,by);
  pmVar3 = (finiteAutomation->
           super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (iVar7._M_node == &pmVar3[start]._M_t._M_impl.super__Rb_tree_header._M_header) {
    __l._M_len = 1;
    __l._M_array = &local_ac;
    local_ac = final;
    std::set<int,_std::less<int>,_std::allocator<int>_>::set
              ((set<int,_std::less<int>,_std::allocator<int>_> *)&local_a8,__l,&local_b1,&local_b2);
    paVar1 = &local_78.first.field_2;
    pcVar4 = (by->_M_dataplus)._M_p;
    local_78.first._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_78,pcVar4,pcVar4 + by->_M_string_length);
    local_78.second._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_78.second._M_t._M_impl.super__Rb_tree_header._M_header;
    if (local_a8._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
      psVar5 = &local_78.second;
      local_a8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_78.second._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_78.second._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           local_78.second._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    }
    else {
      p_Var2 = &local_a8._M_impl.super__Rb_tree_header;
      local_78.second._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           local_a8._M_impl.super__Rb_tree_header._M_header._M_parent;
      (local_a8._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
           local_78.second._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      psVar5 = (set<int,_std::less<int>,_std::allocator<int>_> *)&local_a8._M_impl;
      local_a8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_78.second._M_t._M_impl.super__Rb_tree_header._M_node_count =
           local_a8._M_impl.super__Rb_tree_header._M_node_count;
      local_78.second._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           local_a8._M_impl.super__Rb_tree_header._M_header._M_left;
      local_78.second._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           local_a8._M_impl.super__Rb_tree_header._M_header._M_right;
      local_a8._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
      local_a8._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
    }
    *(size_t *)((long)&(psVar5->_M_t)._M_impl.super__Rb_tree_header + 0x20) = 0;
    local_78.second._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
         local_a8._M_impl.super__Rb_tree_header._M_header._M_color;
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::set<int,std::less<int>,std::allocator<int>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::set<int,std::less<int>,std::allocator<int>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::set<int,std::less<int>,std::allocator<int>>>>>
    ::
    _M_emplace_unique<std::pair<std::__cxx11::string,std::set<int,std::less<int>,std::allocator<int>>>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::set<int,std::less<int>,std::allocator<int>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::set<int,std::less<int>,std::allocator<int>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::set<int,std::less<int>,std::allocator<int>>>>>
                *)(pmVar3 + start),&local_78);
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              (&local_78.second._M_t);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78.first._M_dataplus._M_p != paVar1) {
      operator_delete(local_78.first._M_dataplus._M_p,
                      local_78.first.field_2._M_allocated_capacity + 1);
    }
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              (&local_a8);
    bVar6 = 1;
  }
  else {
    pVar8 = std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
            _M_insert_unique<int_const&>
                      ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                       (iVar7._M_node + 2),&local_b0);
    bVar6 = pVar8.second;
  }
  return (bool)(bVar6 & 1);
}

Assistant:

bool insertToFiniteAutomation(adjacencyType & finiteAutomation, int start, int final, string & by) {
    auto existIter = finiteAutomation[start].find(by);
    if (existIter != finiteAutomation[start].end()) {
        return existIter->second.insert(final).second;
    }
    finiteAutomation[start].insert(make_pair(by, set<int>{final}));
    return true;
}